

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textbox_base.cpp
# Opt level: O2

void __thiscall cppurses::detail::Textbox_base::increment_cursor_right(Textbox_base *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar1 = cursor_index(this);
  if (sVar1 == ((long)(this->super_Text_display).contents_.
                      super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                      super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->super_Text_display).contents_.
                     super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                     super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x18) {
    return;
  }
  sVar1 = Text_display::bottom_line(&this->super_Text_display);
  sVar1 = Text_display::first_index_at(&this->super_Text_display,sVar1 + 1);
  sVar2 = cursor_index(this);
  if (sVar2 == sVar1 - 1) {
    sVar1 = (this->super_Text_display).super_Widget.cursor.position_.y;
    sVar3 = Widget::height((Widget *)this);
    if (sVar1 == sVar3 - 1) {
      (*(this->super_Text_display).super_Widget._vptr_Widget[0x2b])(this,1);
    }
  }
  set_cursor(this,sVar2 + 1);
  return;
}

Assistant:

void Textbox_base::increment_cursor_right() {
    if (this->cursor_index() == this->contents().size()) {
        return;
    }
    auto true_last_index = this->first_index_at(this->bottom_line() + 1) - 1;
    auto cursor_index = this->cursor_index();
    if (cursor_index == true_last_index &&
        this->cursor.y() == this->height() - 1) {
        this->scroll_down(1);
    }
    this->set_cursor(cursor_index + 1);
}